

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O3

QRgbaFloat32 *
fetchRGBA16FToRGBA32F_avx2
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  undefined1 auVar1 [16];
  QRgbaFloat32 QVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  ulong uVar8;
  QRgbaFloat32 *pQVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  
  uVar8 = 0;
  if (1 < count) {
    uVar7 = 0;
    pQVar9 = buffer;
    do {
      auVar5 = vcvtph2ps_f16c(*(undefined1 (*) [16])(src + uVar7 * 8 + (long)index * 8));
      auVar3 = vshufps_avx(auVar5,auVar5,0xff);
      auVar6._4_4_ = auVar3._4_4_ * auVar5._4_4_;
      auVar6._0_4_ = auVar3._0_4_ * auVar5._0_4_;
      auVar6._8_4_ = auVar3._8_4_ * auVar5._8_4_;
      auVar6._12_4_ = auVar3._12_4_ * auVar5._12_4_;
      auVar6._16_4_ = auVar3._16_4_ * auVar5._16_4_;
      auVar6._20_4_ = auVar3._20_4_ * auVar5._20_4_;
      auVar6._24_4_ = auVar3._24_4_ * auVar5._24_4_;
      auVar6._28_4_ = auVar3._28_4_;
      auVar3 = vblendps_avx(auVar6,auVar5,0x88);
      *(undefined1 (*) [32])pQVar9 = auVar3;
      uVar8 = uVar7 + 2;
      pQVar9 = pQVar9 + 2;
      uVar10 = uVar7 + 3;
      uVar7 = uVar8;
    } while (uVar10 < (uint)count);
  }
  if ((int)uVar8 < count) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(src + (uVar8 & 0xffffffff) * 8 + (long)index * 8);
    auVar4 = vcvtph2ps_f16c(auVar1);
    auVar1 = vshufps_avx(auVar4,auVar4,0xff);
    auVar11._0_4_ = auVar1._0_4_ * auVar4._0_4_;
    auVar11._4_4_ = auVar1._4_4_ * auVar4._4_4_;
    auVar11._8_4_ = auVar1._8_4_ * auVar4._8_4_;
    auVar11._12_4_ = auVar1._12_4_ * auVar4._12_4_;
    QVar2 = (QRgbaFloat32)vblendps_avx(auVar11,auVar4,8);
    buffer[uVar8 & 0xffffffff] = QVar2;
  }
  return buffer;
}

Assistant:

const QRgbaFloat32 *QT_FASTCALL fetchRGBA16FToRGBA32F_avx2(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                       const QList<QRgb> *, QDitherInfo *)
{
    const quint64 *s = reinterpret_cast<const quint64 *>(src) + index;
    int i = 0;
    for (; i + 1 < count; i += 2) {
        __m256 vsf = _mm256_cvtph_ps(_mm_loadu_si128((const __m128i *)(s + i)));
        __m256 vsa = _mm256_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm256_mul_ps(vsf, vsa);
        vsf = _mm256_blend_ps(vsf, vsa, 0x88);
        _mm256_storeu_ps((float *)(buffer + i), vsf);
    }
    if (i < count) {
        __m128 vsf = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i *)(s + i)));
        __m128 vsa = _mm_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm_mul_ps(vsf, vsa);
        vsf = _mm_insert_ps(vsf, vsa, 0x30);
        _mm_storeu_ps((float *)(buffer + i), vsf);
    }
    return buffer;
}